

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O1

void * __thiscall
entt::basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::get
          (basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *this,entity_type entt)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  int __c;
  
  bVar1 = contains(this,entt);
  if (bVar1) {
    pcVar3 = index(this,(char *)(ulong)entt,__c);
    iVar2 = (**this->_vptr_basic_sparse_set)(this,pcVar3);
    return (void *)CONCAT44(extraout_var,iVar2);
  }
  __assert_fail("contains(entt)",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x3487,
                "const void *entt::basic_sparse_set<entt::entity>::get(const entity_type) const [Entity = entt::entity]"
               );
}

Assistant:

const void *get(const entity_type entt) const ENTT_NOEXCEPT {
        ENTT_ASSERT(contains(entt), "Set does not contain entity");
        return get_at(index(entt));
    }